

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti_test.c
# Opt level: O0

nifti_image * generate_reference_image(char *write_image_filename,int *Errors)

{
  nifti_1_header nhdr;
  uint uVar1;
  int iVar2;
  nifti_image *nim;
  void *pvVar3;
  long lVar4;
  int *piVar5;
  undefined8 *puVar6;
  byte bVar7;
  undefined1 in_stack_fffffffffffffd08 [344];
  int local_190;
  int i;
  uint NumVoxels;
  nifti_image *reference_image;
  int swapsize;
  int nbyper;
  nifti_1_header reference_header;
  int *Errors_local;
  char *write_image_filename_local;
  
  bVar7 = 0;
  unique0x10000566 = Errors;
  memset(&swapsize,0,0x15c);
  swapsize = 0x15c;
  reference_header.db_name[0x10] = 'r';
  reference_header.db_name[10] = '\0';
  reference_header.db_name[0xb] = '@';
  reference_header.db_name[0xc] = '\0';
  reference_header.db_name[0xd] = '\0';
  reference_header.extents._0_2_ = 5;
  reference_header.extents._2_2_ = 0x17;
  reference_header.session_error = 0x11;
  reference_header.regular = '\v';
  reference_header.dim_info = '\0';
  reference_header.dim[0] = 7;
  reference_header.dim[1] = 3;
  reference_header.dim[2] = 1;
  reference_header.dim[3] = 1;
  reference_header.dim[4] = 0x2112;
  reference_header.dim[5] = 0x4b1a;
  reference_header.dim[6] = 0x79a3;
  reference_header.dim[7] = 0x4e6b;
  reference_header.intent_p1 = -1234.0;
  reference_header.intent_p2._0_2_ = 0x3e9;
  reference_header.intent_p2._2_2_ = 8;
  reference_header.intent_code = 0;
  reference_header.datatype = -0x4080;
  reference_header.bitpix = 0;
  reference_header.slice_start = 16000;
  reference_header.pixdim[0] = 0.5;
  reference_header.pixdim[1] = 1.0;
  reference_header.pixdim[2] = 2.0;
  reference_header.pixdim[3] = 4.0;
  reference_header.pixdim[4] = -2e+10;
  reference_header.pixdim[5] = -2e+10;
  reference_header.pixdim[6] = 0.0;
  reference_header.pixdim[7] = 0.25;
  reference_header.vox_offset = 128.0;
  reference_header.aux_file[0x10] = '\x01';
  reference_header.aux_file[0x11] = '\0';
  reference_header.aux_file[0x14] = '\0';
  reference_header.aux_file[0x15] = '\0';
  reference_header.aux_file[0x16] = '\0';
  reference_header.aux_file[0x17] = -0x41;
  reference_header.qform_code = 0;
  reference_header.sform_code = 0x3f00;
  reference_header.quatern_b = -0.5;
  reference_header.quatern_c = 11.5;
  reference_header.quatern_d = 8.5;
  reference_header.qoffset_x = 5.5;
  reference_header.aux_file[0x12] = '\x01';
  reference_header.aux_file[0x13] = '\0';
  reference_header.qoffset_y = 0.5;
  reference_header.qoffset_z = 0.0;
  reference_header.srow_x[0] = 0.0;
  reference_header.srow_x[1] = 0.0;
  reference_header.srow_x[2] = 0.0;
  reference_header.srow_x[3] = 1.0;
  reference_header.srow_y[0] = 0.0;
  reference_header.srow_y[1] = 0.0;
  reference_header.srow_y[2] = 0.0;
  reference_header.srow_y[3] = 0.0;
  reference_header.srow_z[0] = 2.0;
  reference_header.srow_z[1] = 0.0;
  builtin_strncpy(reference_header.intent_name + 8,"n+1",4);
  strncpy((char *)(reference_header.srow_z + 2),
          "PHANTOM_DATA to be used for regression testing the nifti reader/writer",0x10);
  strncpy((char *)&reference_header.glmax,
          "This is a very long dialog here to use up more than 80 characters of space to test to see if the code is robust enough to deal appropriatly with very long and obnoxious lines."
          ,0x50);
  nifti_datatype_sizes
            ((int)reference_header.intent_p2._2_2_,(int *)((long)&reference_image + 4),
             (int *)&reference_image);
  reference_header.intent_p3._0_2_ = (short)(reference_image._4_4_ << 3);
  piVar5 = &swapsize;
  puVar6 = (undefined8 *)&stack0xfffffffffffffd08;
  for (lVar4 = 0x2b; lVar4 != 0; lVar4 = lVar4 + -1) {
    *puVar6 = *(undefined8 *)piVar5;
    piVar5 = piVar5 + (ulong)bVar7 * -4 + 2;
    puVar6 = puVar6 + (ulong)bVar7 * -2 + 1;
  }
  nhdr.magic[0] = reference_header.intent_name[8];
  nhdr.magic[1] = reference_header.intent_name[9];
  nhdr.magic[2] = reference_header.intent_name[10];
  nhdr.magic[3] = reference_header.intent_name[0xb];
  nhdr.sizeof_hdr = in_stack_fffffffffffffd08._0_4_;
  nhdr.data_type[0] = in_stack_fffffffffffffd08[4];
  nhdr.data_type[1] = in_stack_fffffffffffffd08[5];
  nhdr.data_type[2] = in_stack_fffffffffffffd08[6];
  nhdr.data_type[3] = in_stack_fffffffffffffd08[7];
  nhdr.data_type[4] = in_stack_fffffffffffffd08[8];
  nhdr.data_type[5] = in_stack_fffffffffffffd08[9];
  nhdr.data_type[6] = in_stack_fffffffffffffd08[10];
  nhdr.data_type[7] = in_stack_fffffffffffffd08[0xb];
  nhdr.data_type[8] = in_stack_fffffffffffffd08[0xc];
  nhdr.data_type[9] = in_stack_fffffffffffffd08[0xd];
  nhdr.db_name[0] = in_stack_fffffffffffffd08[0xe];
  nhdr.db_name[1] = in_stack_fffffffffffffd08[0xf];
  nhdr.db_name[2] = in_stack_fffffffffffffd08[0x10];
  nhdr.db_name[3] = in_stack_fffffffffffffd08[0x11];
  nhdr.db_name[4] = in_stack_fffffffffffffd08[0x12];
  nhdr.db_name[5] = in_stack_fffffffffffffd08[0x13];
  nhdr.db_name[6] = in_stack_fffffffffffffd08[0x14];
  nhdr.db_name[7] = in_stack_fffffffffffffd08[0x15];
  nhdr.db_name[8] = in_stack_fffffffffffffd08[0x16];
  nhdr.db_name[9] = in_stack_fffffffffffffd08[0x17];
  nhdr.db_name[10] = in_stack_fffffffffffffd08[0x18];
  nhdr.db_name[0xb] = in_stack_fffffffffffffd08[0x19];
  nhdr.db_name[0xc] = in_stack_fffffffffffffd08[0x1a];
  nhdr.db_name[0xd] = in_stack_fffffffffffffd08[0x1b];
  nhdr.db_name[0xe] = in_stack_fffffffffffffd08[0x1c];
  nhdr.db_name[0xf] = in_stack_fffffffffffffd08[0x1d];
  nhdr.db_name[0x10] = in_stack_fffffffffffffd08[0x1e];
  nhdr.db_name[0x11] = in_stack_fffffffffffffd08[0x1f];
  nhdr.extents = in_stack_fffffffffffffd08._32_4_;
  nhdr.session_error = in_stack_fffffffffffffd08._36_2_;
  nhdr.regular = in_stack_fffffffffffffd08[0x26];
  nhdr.dim_info = in_stack_fffffffffffffd08[0x27];
  nhdr.dim[0] = in_stack_fffffffffffffd08._40_2_;
  nhdr.dim[1] = in_stack_fffffffffffffd08._42_2_;
  nhdr.dim[2] = in_stack_fffffffffffffd08._44_2_;
  nhdr.dim[3] = in_stack_fffffffffffffd08._46_2_;
  nhdr.dim[4] = in_stack_fffffffffffffd08._48_2_;
  nhdr.dim[5] = in_stack_fffffffffffffd08._50_2_;
  nhdr.dim[6] = in_stack_fffffffffffffd08._52_2_;
  nhdr.dim[7] = in_stack_fffffffffffffd08._54_2_;
  nhdr.intent_p1 = (float)in_stack_fffffffffffffd08._56_4_;
  nhdr.intent_p2 = (float)in_stack_fffffffffffffd08._60_4_;
  nhdr.intent_p3 = (float)in_stack_fffffffffffffd08._64_4_;
  nhdr.intent_code = in_stack_fffffffffffffd08._68_2_;
  nhdr.datatype = in_stack_fffffffffffffd08._70_2_;
  nhdr.bitpix = in_stack_fffffffffffffd08._72_2_;
  nhdr.slice_start = in_stack_fffffffffffffd08._74_2_;
  nhdr.pixdim[0] = (float)in_stack_fffffffffffffd08._76_4_;
  nhdr.pixdim[1] = (float)in_stack_fffffffffffffd08._80_4_;
  nhdr.pixdim[2] = (float)in_stack_fffffffffffffd08._84_4_;
  nhdr.pixdim[3] = (float)in_stack_fffffffffffffd08._88_4_;
  nhdr.pixdim[4] = (float)in_stack_fffffffffffffd08._92_4_;
  nhdr.pixdim[5] = (float)in_stack_fffffffffffffd08._96_4_;
  nhdr.pixdim[6] = (float)in_stack_fffffffffffffd08._100_4_;
  nhdr.pixdim[7] = (float)in_stack_fffffffffffffd08._104_4_;
  nhdr.vox_offset = (float)in_stack_fffffffffffffd08._108_4_;
  nhdr.scl_slope = (float)in_stack_fffffffffffffd08._112_4_;
  nhdr.scl_inter = (float)in_stack_fffffffffffffd08._116_4_;
  nhdr.slice_end = in_stack_fffffffffffffd08._120_2_;
  nhdr.slice_code = in_stack_fffffffffffffd08[0x7a];
  nhdr.xyzt_units = in_stack_fffffffffffffd08[0x7b];
  nhdr.cal_max = (float)in_stack_fffffffffffffd08._124_4_;
  nhdr.cal_min = (float)in_stack_fffffffffffffd08._128_4_;
  nhdr.slice_duration = (float)in_stack_fffffffffffffd08._132_4_;
  nhdr.toffset = (float)in_stack_fffffffffffffd08._136_4_;
  nhdr.glmax = in_stack_fffffffffffffd08._140_4_;
  nhdr.glmin = in_stack_fffffffffffffd08._144_4_;
  nhdr.descrip[0] = in_stack_fffffffffffffd08[0x94];
  nhdr.descrip[1] = in_stack_fffffffffffffd08[0x95];
  nhdr.descrip[2] = in_stack_fffffffffffffd08[0x96];
  nhdr.descrip[3] = in_stack_fffffffffffffd08[0x97];
  nhdr.descrip[4] = in_stack_fffffffffffffd08[0x98];
  nhdr.descrip[5] = in_stack_fffffffffffffd08[0x99];
  nhdr.descrip[6] = in_stack_fffffffffffffd08[0x9a];
  nhdr.descrip[7] = in_stack_fffffffffffffd08[0x9b];
  nhdr.descrip[8] = in_stack_fffffffffffffd08[0x9c];
  nhdr.descrip[9] = in_stack_fffffffffffffd08[0x9d];
  nhdr.descrip[10] = in_stack_fffffffffffffd08[0x9e];
  nhdr.descrip[0xb] = in_stack_fffffffffffffd08[0x9f];
  nhdr.descrip[0xc] = in_stack_fffffffffffffd08[0xa0];
  nhdr.descrip[0xd] = in_stack_fffffffffffffd08[0xa1];
  nhdr.descrip[0xe] = in_stack_fffffffffffffd08[0xa2];
  nhdr.descrip[0xf] = in_stack_fffffffffffffd08[0xa3];
  nhdr.descrip[0x10] = in_stack_fffffffffffffd08[0xa4];
  nhdr.descrip[0x11] = in_stack_fffffffffffffd08[0xa5];
  nhdr.descrip[0x12] = in_stack_fffffffffffffd08[0xa6];
  nhdr.descrip[0x13] = in_stack_fffffffffffffd08[0xa7];
  nhdr.descrip[0x14] = in_stack_fffffffffffffd08[0xa8];
  nhdr.descrip[0x15] = in_stack_fffffffffffffd08[0xa9];
  nhdr.descrip[0x16] = in_stack_fffffffffffffd08[0xaa];
  nhdr.descrip[0x17] = in_stack_fffffffffffffd08[0xab];
  nhdr.descrip[0x18] = in_stack_fffffffffffffd08[0xac];
  nhdr.descrip[0x19] = in_stack_fffffffffffffd08[0xad];
  nhdr.descrip[0x1a] = in_stack_fffffffffffffd08[0xae];
  nhdr.descrip[0x1b] = in_stack_fffffffffffffd08[0xaf];
  nhdr.descrip[0x1c] = in_stack_fffffffffffffd08[0xb0];
  nhdr.descrip[0x1d] = in_stack_fffffffffffffd08[0xb1];
  nhdr.descrip[0x1e] = in_stack_fffffffffffffd08[0xb2];
  nhdr.descrip[0x1f] = in_stack_fffffffffffffd08[0xb3];
  nhdr.descrip[0x20] = in_stack_fffffffffffffd08[0xb4];
  nhdr.descrip[0x21] = in_stack_fffffffffffffd08[0xb5];
  nhdr.descrip[0x22] = in_stack_fffffffffffffd08[0xb6];
  nhdr.descrip[0x23] = in_stack_fffffffffffffd08[0xb7];
  nhdr.descrip[0x24] = in_stack_fffffffffffffd08[0xb8];
  nhdr.descrip[0x25] = in_stack_fffffffffffffd08[0xb9];
  nhdr.descrip[0x26] = in_stack_fffffffffffffd08[0xba];
  nhdr.descrip[0x27] = in_stack_fffffffffffffd08[0xbb];
  nhdr.descrip[0x28] = in_stack_fffffffffffffd08[0xbc];
  nhdr.descrip[0x29] = in_stack_fffffffffffffd08[0xbd];
  nhdr.descrip[0x2a] = in_stack_fffffffffffffd08[0xbe];
  nhdr.descrip[0x2b] = in_stack_fffffffffffffd08[0xbf];
  nhdr.descrip[0x2c] = in_stack_fffffffffffffd08[0xc0];
  nhdr.descrip[0x2d] = in_stack_fffffffffffffd08[0xc1];
  nhdr.descrip[0x2e] = in_stack_fffffffffffffd08[0xc2];
  nhdr.descrip[0x2f] = in_stack_fffffffffffffd08[0xc3];
  nhdr.descrip[0x30] = in_stack_fffffffffffffd08[0xc4];
  nhdr.descrip[0x31] = in_stack_fffffffffffffd08[0xc5];
  nhdr.descrip[0x32] = in_stack_fffffffffffffd08[0xc6];
  nhdr.descrip[0x33] = in_stack_fffffffffffffd08[199];
  nhdr.descrip[0x34] = in_stack_fffffffffffffd08[200];
  nhdr.descrip[0x35] = in_stack_fffffffffffffd08[0xc9];
  nhdr.descrip[0x36] = in_stack_fffffffffffffd08[0xca];
  nhdr.descrip[0x37] = in_stack_fffffffffffffd08[0xcb];
  nhdr.descrip[0x38] = in_stack_fffffffffffffd08[0xcc];
  nhdr.descrip[0x39] = in_stack_fffffffffffffd08[0xcd];
  nhdr.descrip[0x3a] = in_stack_fffffffffffffd08[0xce];
  nhdr.descrip[0x3b] = in_stack_fffffffffffffd08[0xcf];
  nhdr.descrip[0x3c] = in_stack_fffffffffffffd08[0xd0];
  nhdr.descrip[0x3d] = in_stack_fffffffffffffd08[0xd1];
  nhdr.descrip[0x3e] = in_stack_fffffffffffffd08[0xd2];
  nhdr.descrip[0x3f] = in_stack_fffffffffffffd08[0xd3];
  nhdr.descrip[0x40] = in_stack_fffffffffffffd08[0xd4];
  nhdr.descrip[0x41] = in_stack_fffffffffffffd08[0xd5];
  nhdr.descrip[0x42] = in_stack_fffffffffffffd08[0xd6];
  nhdr.descrip[0x43] = in_stack_fffffffffffffd08[0xd7];
  nhdr.descrip[0x44] = in_stack_fffffffffffffd08[0xd8];
  nhdr.descrip[0x45] = in_stack_fffffffffffffd08[0xd9];
  nhdr.descrip[0x46] = in_stack_fffffffffffffd08[0xda];
  nhdr.descrip[0x47] = in_stack_fffffffffffffd08[0xdb];
  nhdr.descrip[0x48] = in_stack_fffffffffffffd08[0xdc];
  nhdr.descrip[0x49] = in_stack_fffffffffffffd08[0xdd];
  nhdr.descrip[0x4a] = in_stack_fffffffffffffd08[0xde];
  nhdr.descrip[0x4b] = in_stack_fffffffffffffd08[0xdf];
  nhdr.descrip[0x4c] = in_stack_fffffffffffffd08[0xe0];
  nhdr.descrip[0x4d] = in_stack_fffffffffffffd08[0xe1];
  nhdr.descrip[0x4e] = in_stack_fffffffffffffd08[0xe2];
  nhdr.descrip[0x4f] = in_stack_fffffffffffffd08[0xe3];
  nhdr.aux_file[0] = in_stack_fffffffffffffd08[0xe4];
  nhdr.aux_file[1] = in_stack_fffffffffffffd08[0xe5];
  nhdr.aux_file[2] = in_stack_fffffffffffffd08[0xe6];
  nhdr.aux_file[3] = in_stack_fffffffffffffd08[0xe7];
  nhdr.aux_file[4] = in_stack_fffffffffffffd08[0xe8];
  nhdr.aux_file[5] = in_stack_fffffffffffffd08[0xe9];
  nhdr.aux_file[6] = in_stack_fffffffffffffd08[0xea];
  nhdr.aux_file[7] = in_stack_fffffffffffffd08[0xeb];
  nhdr.aux_file[8] = in_stack_fffffffffffffd08[0xec];
  nhdr.aux_file[9] = in_stack_fffffffffffffd08[0xed];
  nhdr.aux_file[10] = in_stack_fffffffffffffd08[0xee];
  nhdr.aux_file[0xb] = in_stack_fffffffffffffd08[0xef];
  nhdr.aux_file[0xc] = in_stack_fffffffffffffd08[0xf0];
  nhdr.aux_file[0xd] = in_stack_fffffffffffffd08[0xf1];
  nhdr.aux_file[0xe] = in_stack_fffffffffffffd08[0xf2];
  nhdr.aux_file[0xf] = in_stack_fffffffffffffd08[0xf3];
  nhdr.aux_file[0x10] = in_stack_fffffffffffffd08[0xf4];
  nhdr.aux_file[0x11] = in_stack_fffffffffffffd08[0xf5];
  nhdr.aux_file[0x12] = in_stack_fffffffffffffd08[0xf6];
  nhdr.aux_file[0x13] = in_stack_fffffffffffffd08[0xf7];
  nhdr.aux_file[0x14] = in_stack_fffffffffffffd08[0xf8];
  nhdr.aux_file[0x15] = in_stack_fffffffffffffd08[0xf9];
  nhdr.aux_file[0x16] = in_stack_fffffffffffffd08[0xfa];
  nhdr.aux_file[0x17] = in_stack_fffffffffffffd08[0xfb];
  nhdr.qform_code = in_stack_fffffffffffffd08._252_2_;
  nhdr.sform_code = in_stack_fffffffffffffd08._254_2_;
  nhdr.quatern_b = (float)in_stack_fffffffffffffd08._256_4_;
  nhdr.quatern_c = (float)in_stack_fffffffffffffd08._260_4_;
  nhdr.quatern_d = (float)in_stack_fffffffffffffd08._264_4_;
  nhdr.qoffset_x = (float)in_stack_fffffffffffffd08._268_4_;
  nhdr.qoffset_y = (float)in_stack_fffffffffffffd08._272_4_;
  nhdr.qoffset_z = (float)in_stack_fffffffffffffd08._276_4_;
  nhdr.srow_x[0] = (float)in_stack_fffffffffffffd08._280_4_;
  nhdr.srow_x[1] = (float)in_stack_fffffffffffffd08._284_4_;
  nhdr.srow_x[2] = (float)in_stack_fffffffffffffd08._288_4_;
  nhdr.srow_x[3] = (float)in_stack_fffffffffffffd08._292_4_;
  nhdr.srow_y[0] = (float)in_stack_fffffffffffffd08._296_4_;
  nhdr.srow_y[1] = (float)in_stack_fffffffffffffd08._300_4_;
  nhdr.srow_y[2] = (float)in_stack_fffffffffffffd08._304_4_;
  nhdr.srow_y[3] = (float)in_stack_fffffffffffffd08._308_4_;
  nhdr.srow_z[0] = (float)in_stack_fffffffffffffd08._312_4_;
  nhdr.srow_z[1] = (float)in_stack_fffffffffffffd08._316_4_;
  nhdr.srow_z[2] = (float)in_stack_fffffffffffffd08._320_4_;
  nhdr.srow_z[3] = (float)in_stack_fffffffffffffd08._324_4_;
  nhdr.intent_name[0] = in_stack_fffffffffffffd08[0x148];
  nhdr.intent_name[1] = in_stack_fffffffffffffd08[0x149];
  nhdr.intent_name[2] = in_stack_fffffffffffffd08[0x14a];
  nhdr.intent_name[3] = in_stack_fffffffffffffd08[0x14b];
  nhdr.intent_name[4] = in_stack_fffffffffffffd08[0x14c];
  nhdr.intent_name[5] = in_stack_fffffffffffffd08[0x14d];
  nhdr.intent_name[6] = in_stack_fffffffffffffd08[0x14e];
  nhdr.intent_name[7] = in_stack_fffffffffffffd08[0x14f];
  nhdr.intent_name[8] = in_stack_fffffffffffffd08[0x150];
  nhdr.intent_name[9] = in_stack_fffffffffffffd08[0x151];
  nhdr.intent_name[10] = in_stack_fffffffffffffd08[0x152];
  nhdr.intent_name[0xb] = in_stack_fffffffffffffd08[0x153];
  nhdr.intent_name[0xc] = in_stack_fffffffffffffd08[0x154];
  nhdr.intent_name[0xd] = in_stack_fffffffffffffd08[0x155];
  nhdr.intent_name[0xe] = in_stack_fffffffffffffd08[0x156];
  nhdr.intent_name[0xf] = in_stack_fffffffffffffd08[0x157];
  nim = nifti_convert_nhdr2nim(nhdr,write_image_filename);
  uVar1 = nim->nx * nim->ny * nim->nz * nim->nt * nim->nu;
  pvVar3 = calloc((ulong)uVar1,4);
  nim->data = pvVar3;
  _PrintTest(0x65,"Checking memory allocation",(uint)(nim->data == (void *)0x0),NIFTITEST_TRUE,
             stack0xffffffffffffffe8);
  for (local_190 = 0; local_190 < (int)uVar1; local_190 = local_190 + 1) {
    *(int *)((long)nim->data + (long)local_190 * 4) = local_190;
  }
  iVar2 = nifti_set_filenames(nim,write_image_filename,0,0);
  _PrintTest(0x6e,"Setting filenames",(uint)(iVar2 != 0),NIFTITEST_TRUE,stack0xffffffffffffffe8);
  iVar2 = nifti_set_type_from_names(nim);
  _PrintTest(0x6f,"Setting type from names",(uint)(iVar2 != 0),NIFTITEST_TRUE,
             stack0xffffffffffffffe8);
  _PrintTest(0x71,"Check reference_image data is non null",(uint)(nim->data == (void *)0x0),
             NIFTITEST_TRUE,stack0xffffffffffffffe8);
  return nim;
}

Assistant:

nifti_image * generate_reference_image( const char * write_image_filename , int * const Errors)
{
  nifti_1_header reference_header;
  memset(&reference_header,0,sizeof(reference_header));
  reference_header.sizeof_hdr=sizeof(reference_header);
  reference_header.regular='r';
  reference_header.extents=16384;

  reference_header.dim[0]=5;
  reference_header.dim[1]=23;
  reference_header.dim[2]=17;
  reference_header.dim[3]=11;
  reference_header.dim[4]=7;
  reference_header.dim[5]=3;
  reference_header.dim[6]=1; //This MUST be 1 anything else is invalid due to code that usees huristics to fix other possible problems;
  reference_header.dim[7]=1; //This MUST be 1 anything else is invalid due to code that usees huristics to fix other possible problems;
  reference_header.intent_p1=10101010.101F;
  reference_header.intent_p2=987654321.0F;
  reference_header.intent_p3=-1234.0F;
  reference_header.intent_code=NIFTI_INTENT_ESTIMATE;
  reference_header.datatype=DT_INT32;
  reference_header.pixdim[0]=-1.0F; /* this is really qfac */
  reference_header.pixdim[1]=0.25F;
  reference_header.pixdim[2]=0.5F;
  reference_header.pixdim[3]=1.0F;
  reference_header.pixdim[4]=2.0F;
  reference_header.pixdim[5]=4.0F;
  reference_header.pixdim[6]=-2.0e10F;
  reference_header.pixdim[7]=-2.0e10F;
  reference_header.vox_offset=0;
  reference_header.scl_slope=0.25;
  reference_header.scl_inter=128;
  reference_header.qform_code=NIFTI_XFORM_SCANNER_ANAT;
  reference_header.quatern_b=-0.5F;
  reference_header.quatern_c= 0.5F;
  reference_header.quatern_d=-0.5F;
  reference_header.qoffset_x=reference_header.dim[1]/2.0F;
  reference_header.qoffset_y=reference_header.dim[2]/2.0F;
  reference_header.qoffset_z=reference_header.dim[3]/2.0F;
  reference_header.sform_code=NIFTI_XFORM_SCANNER_ANAT;
  reference_header.srow_x[0]=0.5;
  reference_header.srow_x[1]=0.0;
  reference_header.srow_x[2]=0.0;
  reference_header.srow_x[3]=0.0;
  reference_header.srow_y[0]=0.0;
  reference_header.srow_y[1]=1.0;
  reference_header.srow_y[2]=0.0;
  reference_header.srow_y[3]=0.0;
  reference_header.srow_z[0]=0.0;
  reference_header.srow_z[1]=0.0;
  reference_header.srow_z[2]=2.0;
  reference_header.srow_z[3]=0.0;
  reference_header.magic[0]='n';
  reference_header.magic[1]='+';
  reference_header.magic[2]='1';
  reference_header.magic[3]='\0';
  /* String is purposfully too long */
  strncpy(reference_header.intent_name,"PHANTOM_DATA to be used for regression testing the nifti reader/writer",16);
  strncpy(reference_header.descrip,"This is a very long dialog here to use up more than 80 characters of space to test to see if the code is robust enough to deal appropriatly with very long and obnoxious lines.",80);

  {
  int nbyper;
  int swapsize;
  nifti_datatype_sizes(reference_header.datatype ,&nbyper,&swapsize);
  reference_header.bitpix=nbyper*8;
  }

  nifti_image * reference_image=nifti_convert_nhdr2nim(reference_header,write_image_filename);
  {
  const unsigned int NumVoxels=reference_image->nx*reference_image->ny*reference_image->nz*reference_image->nt*reference_image->nu;
  reference_image->data=(signed int *)calloc(NumVoxels,sizeof(signed int)) ; /*!< pointer to data: nbyper*nvox bytes     */
  PrintTest("Checking memory allocation",reference_image->data ==0 ,NIFTITEST_TRUE,Errors);
  {
  signed int i=0;
  for(; i < (signed int)NumVoxels ; i++)
    {
    ((signed int *)(reference_image->data))[i]=i;
    }
  }
  }
  PrintTest("Setting filenames",nifti_set_filenames( reference_image,write_image_filename, 0, 0 ) != 0, NIFTITEST_TRUE,Errors);
  PrintTest("Setting type from names",nifti_set_type_from_names( reference_image ) != 0, NIFTITEST_TRUE,Errors);
  /*   PrintTest("Checking type and names",nifti_type_and_names_match( reference_image , 1 ) != 1, NIFTITEST_TRUE,Errors); */
  PrintTest("Check reference_image data is non null",(reference_image->data==0),NIFTITEST_TRUE,Errors);
  return reference_image;
}